

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Variable_hasIndirectEquivalentVariable_Test::~Variable_hasIndirectEquivalentVariable_Test
          (Variable_hasIndirectEquivalentVariable_Test *this)

{
  Variable_hasIndirectEquivalentVariable_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Variable, hasIndirectEquivalentVariable)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v2, v3);
    EXPECT_TRUE(v1->hasEquivalentVariable(v3, true));
}